

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O3

void Abc_NtkDeleteAll_rec(Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  long lVar3;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                  ,0x13f,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
  }
  if ((pObj->vFanouts).nSize == 0) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar2 = (void **)malloc(800);
    vNodes->pArray = ppvVar2;
    Abc_NodeCollectFanins(pObj,vNodes);
    Abc_NtkDeleteObj(pObj);
    iVar1 = vNodes->nSize;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        pObj_00 = (Abc_Obj_t *)vNodes->pArray[lVar3];
        if (((*(uint *)&pObj_00->field_0x14 & 0xf) != 7) && ((pObj_00->vFanouts).nSize == 0)) {
          Abc_NtkDeleteAll_rec(pObj_00);
          iVar1 = vNodes->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
    }
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    return;
  }
  __assert_fail("Abc_ObjFanoutNum(pObj) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcObj.c"
                ,0x140,"void Abc_NtkDeleteAll_rec(Abc_Obj_t *)");
}

Assistant:

void Abc_NtkDeleteAll_rec( Abc_Obj_t * pObj )
{
    Vec_Ptr_t * vNodes;
    int i;
    assert( !Abc_ObjIsComplement(pObj) );
    assert( Abc_ObjFanoutNum(pObj) == 0 );
    // delete fanins and fanouts
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NodeCollectFanins( pObj, vNodes );
    Abc_NtkDeleteObj( pObj );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( !Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteAll_rec( pObj );
    Vec_PtrFree( vNodes );
}